

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShaderDrawCallsWhileTFPaused::iterate(GeometryShaderDrawCallsWhileTFPaused *this)

{
  GLuint *pGVar1;
  GeometryShaderDrawCallsWhileTFPaused *pGVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  deUint32 dVar7;
  GLuint GVar8;
  long lVar9;
  long *plVar10;
  undefined4 extraout_var;
  string *psVar11;
  NotSupportedError *this_00;
  undefined1 *puVar12;
  long *plVar13;
  size_type *psVar14;
  TestLog *pTVar15;
  ulong uVar16;
  char *description;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  long lVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  bool has_shader_compilation_failed;
  GeometryShaderDrawCallsWhileTFPaused *local_5d8;
  string *local_5d0;
  string gs_code_specialized;
  GLuint *local_5a8;
  string vs_code_specialized;
  string fs_code_specialized;
  char *tf_varyings [1];
  long local_548;
  long lStack_540;
  char *fs_code_specialized_raw;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  GLuint *local_518;
  char *gs_code_specialized_raw;
  char *gs_code;
  char *vs_code_specialized_raw;
  string gs_max_output_vertices [3];
  string gs_outputs [3];
  string gs_inputs [5];
  undefined1 local_398 [8];
  _func_int **local_390;
  TestLog local_388;
  long lStack_380;
  ios_base local_320 [248];
  undefined8 auStack_228 [2];
  string gs_codes [15];
  
  gs_inputs[0]._M_dataplus._M_p = (pointer)&gs_inputs[0].field_2;
  local_5d8 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)gs_inputs,"points","");
  gs_inputs[1]._M_dataplus._M_p = (pointer)&gs_inputs[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(gs_inputs + 1),"lines","");
  gs_inputs[2]._M_dataplus._M_p = (pointer)&gs_inputs[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(gs_inputs + 2),"lines_adjacency","");
  gs_inputs[3]._M_dataplus._M_p = (pointer)&gs_inputs[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(gs_inputs + 3),"triangles","");
  paVar18 = &gs_inputs[4].field_2;
  gs_inputs[4]._M_dataplus._M_p = (pointer)paVar18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(gs_inputs + 4),"triangles_adjacency","");
  gs_outputs[0]._M_dataplus._M_p = (pointer)&gs_outputs[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)gs_outputs,"points","");
  gs_outputs[1]._M_dataplus._M_p = (pointer)&gs_outputs[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(gs_outputs + 1),"line_strip","");
  paVar21 = &gs_outputs[2].field_2;
  gs_outputs[2]._M_dataplus._M_p = (pointer)paVar21;
  std::__cxx11::string::_M_construct<char_const*>((string *)(gs_outputs + 2),"triangle_strip","");
  gs_max_output_vertices[0]._M_dataplus._M_p = (pointer)&gs_max_output_vertices[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)gs_max_output_vertices,"1","");
  gs_max_output_vertices[1]._M_dataplus._M_p = (pointer)&gs_max_output_vertices[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(gs_max_output_vertices + 1),"2","");
  paVar17 = &gs_max_output_vertices[2].field_2;
  gs_max_output_vertices[2]._M_dataplus._M_p = (pointer)paVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)(gs_max_output_vertices + 2),"3","");
  lVar9 = 0x10;
  do {
    puVar12 = (undefined1 *)((long)&gs_codes[0]._M_dataplus._M_p + lVar9);
    *(undefined1 **)((long)auStack_228 + lVar9) = puVar12;
    *(undefined8 *)((long)auStack_228 + lVar9 + 8) = 0;
    *puVar12 = 0;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x1f0);
  local_5d0 = gs_codes;
  lVar9 = 0;
  do {
    lVar19 = 0;
    do {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fs_code_specialized_raw,"${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (",
                     gs_inputs + lVar9);
      plVar10 = (long *)std::__cxx11::string::append((char *)&fs_code_specialized_raw);
      tf_varyings[0] = (char *)&local_548;
      plVar13 = plVar10 + 2;
      if ((long *)*plVar10 == plVar13) {
        local_548 = *plVar13;
        lStack_540 = plVar10[3];
      }
      else {
        local_548 = *plVar13;
        tf_varyings[0] = (char *)*plVar10;
      }
      *plVar10 = (long)plVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)tf_varyings,
                                   *(ulong *)((long)&gs_outputs[0]._M_dataplus._M_p + lVar19));
      gs_code_specialized._M_dataplus._M_p = (pointer)&gs_code_specialized.field_2;
      psVar14 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar14) {
        gs_code_specialized.field_2._M_allocated_capacity = *psVar14;
        gs_code_specialized.field_2._8_8_ = plVar10[3];
      }
      else {
        gs_code_specialized.field_2._M_allocated_capacity = *psVar14;
        gs_code_specialized._M_dataplus._M_p = (pointer)*plVar10;
      }
      gs_code_specialized._M_string_length = plVar10[1];
      *plVar10 = (long)psVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&gs_code_specialized);
      vs_code_specialized._M_dataplus._M_p = (pointer)&vs_code_specialized.field_2;
      psVar14 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar14) {
        vs_code_specialized.field_2._M_allocated_capacity = *psVar14;
        vs_code_specialized.field_2._8_8_ = plVar10[3];
      }
      else {
        vs_code_specialized.field_2._M_allocated_capacity = *psVar14;
        vs_code_specialized._M_dataplus._M_p = (pointer)*plVar10;
      }
      vs_code_specialized._M_string_length = plVar10[1];
      *plVar10 = (long)psVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&vs_code_specialized,
                                   *(ulong *)((long)&gs_max_output_vertices[0]._M_dataplus._M_p +
                                             lVar19));
      fs_code_specialized._M_dataplus._M_p = (pointer)&fs_code_specialized.field_2;
      psVar14 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar14) {
        fs_code_specialized.field_2._M_allocated_capacity = *psVar14;
        fs_code_specialized.field_2._8_8_ = plVar10[3];
      }
      else {
        fs_code_specialized.field_2._M_allocated_capacity = *psVar14;
        fs_code_specialized._M_dataplus._M_p = (pointer)*plVar10;
      }
      fs_code_specialized._M_string_length = plVar10[1];
      *plVar10 = (long)psVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&fs_code_specialized);
      pTVar15 = (TestLog *)(plVar10 + 2);
      if ((TestLog *)*plVar10 == pTVar15) {
        local_388.m_log = pTVar15->m_log;
        lStack_380 = plVar10[3];
        local_398 = (undefined1  [8])&local_388;
      }
      else {
        local_388.m_log = pTVar15->m_log;
        local_398 = (undefined1  [8])*plVar10;
      }
      local_390 = (_func_int **)plVar10[1];
      *plVar10 = (long)pTVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::operator=
                ((string *)((long)&(local_5d0->_M_dataplus)._M_p + lVar19),(string *)local_398);
      if (local_398 != (undefined1  [8])&local_388) {
        operator_delete((void *)local_398,(ulong)((long)&(local_388.m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fs_code_specialized._M_dataplus._M_p != &fs_code_specialized.field_2) {
        operator_delete(fs_code_specialized._M_dataplus._M_p,
                        fs_code_specialized.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)vs_code_specialized._M_dataplus._M_p != &vs_code_specialized.field_2) {
        operator_delete(vs_code_specialized._M_dataplus._M_p,
                        vs_code_specialized.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gs_code_specialized._M_dataplus._M_p != &gs_code_specialized.field_2) {
        operator_delete(gs_code_specialized._M_dataplus._M_p,
                        gs_code_specialized.field_2._M_allocated_capacity + 1);
      }
      if ((long *)tf_varyings[0] != &local_548) {
        operator_delete(tf_varyings[0],local_548 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fs_code_specialized_raw != &local_528) {
        operator_delete(fs_code_specialized_raw,local_528._M_allocated_capacity + 1);
      }
      lVar19 = lVar19 + 0x20;
    } while (lVar19 != 0x60);
    lVar9 = lVar9 + 1;
    local_5d0 = local_5d0 + 3;
  } while (lVar9 != 5);
  has_shader_compilation_failed = true;
  if ((local_5d8->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0x10b3);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar5 = (*((local_5d8->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar5);
  lVar19 = 0xae;
  do {
    uVar6 = (**(code **)(lVar9 + 0x3c8))();
    *(undefined4 *)
     ((long)&(local_5d8->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode +
     lVar19 * 4) = uVar6;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 0xbd);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glCreateProgram() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x10bd);
  tf_varyings[0] = "out_gs_1";
  lVar19 = 0xae;
  do {
    (**(code **)(lVar9 + 0x14c8))
              (*(undefined4 *)
                ((long)&(local_5d8->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode
                + lVar19 * 4),1,tf_varyings,0x8c8c);
    lVar19 = lVar19 + 1;
  } while (lVar19 != 0xbd);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glTransformFeedbackVaryings() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x10c6);
  GVar8 = (**(code **)(lVar9 + 0x3f0))(0x8b30);
  local_5d8->m_fs_id = GVar8;
  GVar8 = (**(code **)(lVar9 + 0x3f0))(0x8dd9);
  local_5d8->m_gs_id = GVar8;
  GVar8 = (**(code **)(lVar9 + 0x3f0))(0x8b31);
  local_5d8->m_vs_id = GVar8;
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x10cc);
  pGVar2 = local_5d8;
  TestCaseBase::specializeShader_abi_cxx11_
            (&fs_code_specialized,&local_5d8->super_TestCaseBase,1,&dummy_fs_code);
  fs_code_specialized_raw = fs_code_specialized._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (&vs_code_specialized,&pGVar2->super_TestCaseBase,1,&dummy_vs_code);
  vs_code_specialized_raw = vs_code_specialized._M_dataplus._M_p;
  bVar4 = true;
  lVar19 = 0;
  do {
    pGVar2 = local_5d8;
    gs_code = (&gs_codes[0]._M_dataplus)[lVar19]._M_p;
    TestCaseBase::specializeShader_abi_cxx11_
              (&gs_code_specialized,&local_5d8->super_TestCaseBase,1,&gs_code);
    gs_code_specialized_raw = gs_code_specialized._M_dataplus._M_p;
    bVar3 = TestCaseBase::buildProgram
                      (&pGVar2->super_TestCaseBase,*(GLuint *)((long)pGVar2->m_po_ids + lVar19),
                       pGVar2->m_fs_id,1,&fs_code_specialized_raw,pGVar2->m_gs_id,1,
                       &gs_code_specialized_raw,pGVar2->m_vs_id,1,&vs_code_specialized_raw,
                       &has_shader_compilation_failed);
    if (!bVar3) {
      local_398 = (undefined1  [8])
                  ((local_5d8->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_390);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_390,
                 "Program object linking failed whereas a success was expected.",0x3d);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_390);
      std::ios_base::~ios_base(local_320);
      bVar4 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)gs_code_specialized._M_dataplus._M_p != &gs_code_specialized.field_2) {
      operator_delete(gs_code_specialized._M_dataplus._M_p,
                      gs_code_specialized.field_2._M_allocated_capacity + 1);
    }
    lVar19 = lVar19 + 4;
  } while (lVar19 != 0x3c);
  if (bVar4) {
    pGVar1 = &local_5d8->m_vao_id;
    (**(code **)(lVar9 + 0x708))(1,pGVar1);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"glGenVertexArrays() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x10ef);
    (**(code **)(lVar9 + 0xd8))(*pGVar1);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"glBindVertexArray() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x10f2);
    pGVar1 = &local_5d8->m_tfbo_id;
    (**(code **)(lVar9 + 0x6c8))(1,pGVar1);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"glGenBuffers() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x10f6);
    (**(code **)(lVar9 + 0x40))(0x8892,*pGVar1);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"glBindBuffer() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x10f9);
    (**(code **)(lVar9 + 0x150))(0x8892,0x18,0,0x88e1);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"glBufferData() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x10fe);
    (**(code **)(lVar9 + 0x48))(0x8c8e,0,*pGVar1);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"glBindBufferBase() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x1101);
    (**(code **)(lVar9 + 0x5e0))(0x8c89);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"glEnable() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x1104);
    if (bVar4) {
      local_518 = local_5d8->m_po_ids;
      uVar16 = 0;
      do {
        if (bVar4) {
          local_5a8 = local_518;
          psVar11 = (string *)0x0;
          do {
            lVar19 = 0;
            local_5d0 = psVar11;
            do {
              (**(code **)(lVar9 + 0x1680))(local_5a8[lVar19]);
              dVar7 = (**(code **)(lVar9 + 0x800))();
              glu::checkError(dVar7,"glUseProgram() call(s) failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                              ,0x110e);
              (**(code **)(lVar9 + 0x30))(*(undefined4 *)(&DAT_01b86188 + uVar16 * 4));
              dVar7 = (**(code **)(lVar9 + 0x800))();
              glu::checkError(dVar7,"glBeginTransformFeedback() call(s) failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                              ,0x1111);
              (**(code **)(lVar9 + 0xfe0))();
              dVar7 = (**(code **)(lVar9 + 0x800))();
              glu::checkError(dVar7,"glPauseTransformFeedback() call(s) failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                              ,0x1114);
              (**(code **)(lVar9 + 0x538))(*(undefined4 *)(&DAT_01b861a0 + (long)local_5d0 * 4),0,3)
              ;
              iVar5 = (**(code **)(lVar9 + 0x800))();
              (**(code **)(lVar9 + 0x1248))();
              dVar7 = (**(code **)(lVar9 + 0x800))();
              glu::checkError(dVar7,"glResumeTransformFeedback() call(s) failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                              ,0x111a);
              (**(code **)(lVar9 + 0x638))();
              dVar7 = (**(code **)(lVar9 + 0x800))();
              glu::checkError(dVar7,"glEndTransformFeedback() call(s) failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                              ,0x111d);
              if (iVar5 != 0) {
                local_398 = (undefined1  [8])
                            ((local_5d8->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx
                            )->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_390);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_390,
                           "glDrawArrays() call generated an error while transform feedback was paused."
                           ,0x4b);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_390);
                std::ios_base::~ios_base(local_320);
                bVar4 = false;
                break;
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 != 3);
            if ((string *)0x3 < local_5d0) break;
            psVar11 = (string *)((long)&(local_5d0->_M_dataplus)._M_p + 1);
            local_5a8 = local_5a8 + 3;
          } while (bVar4);
        }
      } while ((uVar16 < 2) && (uVar16 = uVar16 + 1, bVar4));
    }
    (**(code **)(lVar9 + 0x4e8))(0x8c89);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"glDisable() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x112e);
  }
  description = "Fail";
  if (bVar4) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((local_5d8->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
             (uint)(byte)~bVar4,description);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vs_code_specialized._M_dataplus._M_p != &vs_code_specialized.field_2) {
    operator_delete(vs_code_specialized._M_dataplus._M_p,
                    vs_code_specialized.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fs_code_specialized._M_dataplus._M_p != &fs_code_specialized.field_2) {
    operator_delete(fs_code_specialized._M_dataplus._M_p,
                    fs_code_specialized.field_2._M_allocated_capacity + 1);
  }
  lVar9 = -0x1e0;
  paVar20 = &gs_codes[0xe].field_2;
  do {
    plVar10 = (long *)(((string *)(paVar20 + -1))->_M_dataplus)._M_p;
    if (paVar20 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar10) {
      operator_delete(plVar10,paVar20->_M_allocated_capacity + 1);
    }
    paVar20 = paVar20 + -2;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  lVar9 = -0x60;
  do {
    plVar10 = (long *)(((string *)(paVar17 + -1))->_M_dataplus)._M_p;
    if (paVar17 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar10) {
      operator_delete(plVar10,paVar17->_M_allocated_capacity + 1);
    }
    paVar17 = paVar17 + -2;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  lVar9 = -0x60;
  do {
    plVar10 = (long *)(((string *)(paVar21 + -1))->_M_dataplus)._M_p;
    if (paVar21 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar10) {
      operator_delete(plVar10,paVar21->_M_allocated_capacity + 1);
    }
    paVar21 = paVar21 + -2;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  lVar9 = -0xa0;
  do {
    plVar10 = (long *)(((string *)(paVar18 + -1))->_M_dataplus)._M_p;
    if (paVar18 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar10) {
      operator_delete(plVar10,paVar18->_M_allocated_capacity + 1);
    }
    paVar18 = paVar18 + -2;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderDrawCallsWhileTFPaused::iterate()
{
	/* Define 15 (all combinations of possible inputs and outputs in geometry shader) Geometry Shaders for purpose of this test. */
	const std::string gs_inputs[]  = { "points", "lines", "lines_adjacency", "triangles", "triangles_adjacency" };
	const std::string gs_outputs[] = { "points", "line_strip", "triangle_strip" };
	const std::string gs_max_output_vertices[] = { "1", "2", "3" };

	const unsigned short number_of_combinations =
		(sizeof(gs_inputs) / sizeof(gs_inputs[0]) * (sizeof(gs_outputs) / sizeof(gs_outputs[0])));

	std::string gs_codes[number_of_combinations];
	glw::GLenum errorCode;

	for (size_t i = 0; i < (sizeof(gs_inputs) / sizeof(gs_inputs[0])) /*5 possible GS inputs*/; ++i)
	{
		for (size_t j = 0; j < (sizeof(gs_outputs) / sizeof(gs_outputs[0])) /*3 possible GS outputs*/; ++j)
		{
			/* This shader will not emit primitives for anything but points.
			 * We do so, because we just need to make sure that, while transform feedback
			 * is paused, all draw calls executed with an active program object which
			 * includes a geometry shader, are valid.
			 */
			gs_codes[j + 3 * i] = "${VERSION}\n"
								  "${GEOMETRY_SHADER_REQUIRE}\n"
								  "\n"
								  "layout (" +
								  gs_inputs[i] + ") in;\n"
												 "layout (" +
								  gs_outputs[j] + ", max_vertices = " + gs_max_output_vertices[j] +
								  ") out;\n"
								  "\n"
								  "out vec2 out_gs_1;\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  "    out_gs_1    = vec2(1.0, 2.0);\n"
								  "    gl_Position = vec4(0, 0, 0, 1);\n"
								  "    EmitVertex();\n"
								  "}\n";
		}
	}

	bool			  has_shader_compilation_failed = true;
	bool			  result						= true;
	const glw::GLuint tf_modes[3]					= { GL_POINTS, GL_LINES, GL_TRIANGLES };
	const glw::GLuint draw_call_modes[5]			= { GL_POINTS, GL_LINES, GL_LINES_ADJACENCY, GL_TRIANGLES,
											 GL_TRIANGLES_ADJACENCY };

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create program objects. */
	for (int i = 0; i < number_of_combinations; ++i)
	{
		m_po_ids[i] = gl.createProgram();
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call(s) failed.");

	/* Specify output variables to be captured. */
	const char* tf_varyings[] = { "out_gs_1" };

	for (int i = 0; i < number_of_combinations; ++i)
	{
		gl.transformFeedbackVaryings(m_po_ids[i], 1 /*count*/, tf_varyings, GL_INTERLEAVED_ATTRIBS);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call(s) failed.");

	/* Create shader objects. */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Try to link the test program object */
	std::string fs_code_specialized		= specializeShader(1, &dummy_fs_code);
	const char* fs_code_specialized_raw = fs_code_specialized.c_str();

	std::string vs_code_specialized		= specializeShader(1, &dummy_vs_code);
	const char* vs_code_specialized_raw = vs_code_specialized.c_str();

	for (int i = 0; i < number_of_combinations; ++i)
	{
		const char* gs_code					= gs_codes[i].c_str();
		std::string gs_code_specialized		= specializeShader(1, &gs_code);
		const char* gs_code_specialized_raw = gs_code_specialized.c_str();

		if (!TestCaseBase::buildProgram(m_po_ids[i], m_fs_id, 1,			  /* n_sh1_body_parts */
										&fs_code_specialized_raw, m_gs_id, 1, /* n_sh2_body_parts */
										&gs_code_specialized_raw, m_vs_id, 1, /* n_sh3_body_parts */
										&vs_code_specialized_raw, &has_shader_compilation_failed))
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Program object linking failed whereas a success was expected."
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	}

	if (!result)
	{
		goto end;
	}

	/* Create Vertex Array Object. */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call(s) failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call(s) failed.");

	/* Create Buffer Object for Transform Feedback data. */
	gl.genBuffers(1, &m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call(s) failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call(s) failed.");

	gl.bufferData(GL_ARRAY_BUFFER,
				  sizeof(glw::GLfloat) * 2 * 3 /* capture 2 float vector components times 3 triangle vertices */, NULL,
				  GL_STREAM_READ);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call(s) failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /*binding index*/, m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call(s) failed.");

	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable() call(s) failed.");

	for (int i = 0; i < 3 /* number of TF modes */ && result; ++i)
	{
		for (int j = 0; j < 5 /*number of draw call modes*/ && result; ++j)
		{
			for (int k = 0; k < 3 /* number of output GS primitive types */; ++k)
			{
				/* Turn on program object. */
				gl.useProgram(m_po_ids[k + 3 * j]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call(s) failed.");

				gl.beginTransformFeedback(tf_modes[i]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call(s) failed.");

				gl.pauseTransformFeedback();
				GLU_EXPECT_NO_ERROR(gl.getError(), "glPauseTransformFeedback() call(s) failed.");

				gl.drawArrays(draw_call_modes[j], 0 /*first*/, 3 /*count*/);
				errorCode = gl.getError();

				gl.resumeTransformFeedback();
				GLU_EXPECT_NO_ERROR(gl.getError(), "glResumeTransformFeedback() call(s) failed.");

				gl.endTransformFeedback();
				GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call(s) failed.");

				/* If draw call fails stop test execution. */
				if (GL_NO_ERROR != errorCode)
				{
					m_testCtx.getLog() << tcu::TestLog::Message
									   << "glDrawArrays() call generated an error while transform feedback was paused."
									   << tcu::TestLog::EndMessage;

					result = false;
					break;
				}
			}
		}
	}

	gl.disable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable() call(s) failed.");

end:

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}